

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O0

void lib::table::RegisterLibTable(State *state)

{
  State *in_RDI;
  TableMemberReg table [5];
  Library lib;
  char *in_stack_ffffffffffffff68;
  anon_union_8_3_6606d591_for_TableMemberReg_1 in_stack_ffffffffffffff70;
  TableMemberReg TStack_80;
  TableMemberReg TStack_68;
  TableMemberReg TStack_50;
  TableMemberReg TStack_38;
  Library local_18;
  
  luna::Library::Library(&local_18,in_RDI);
  luna::TableMemberReg::TableMemberReg((TableMemberReg *)&stack0xffffffffffffff68,"concat",Concat);
  luna::TableMemberReg::TableMemberReg(&TStack_80,"insert",Insert);
  luna::TableMemberReg::TableMemberReg(&TStack_68,"pack",Pack);
  luna::TableMemberReg::TableMemberReg(&TStack_50,"remove",Remove);
  luna::TableMemberReg::TableMemberReg(&TStack_38,"unpack",Unpack);
  luna::Library::RegisterTableFunction<5ul>
            ((Library *)in_stack_ffffffffffffff70.func_,in_stack_ffffffffffffff68,
             (TableMemberReg (*) [5])0x167df9);
  return;
}

Assistant:

void RegisterLibTable(luna::State *state)
    {
        luna::Library lib(state);
        luna::TableMemberReg table[] = {
            { "concat", Concat },
            { "insert", Insert },
            { "pack", Pack },
            { "remove", Remove },
            { "unpack", Unpack }
        };

        lib.RegisterTableFunction("table", table);
    }